

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O0

QByteArray * QUtf8::convertFromUnicode(QStringView in)

{
  char *pcVar1;
  char *pcVar2;
  __off_t __length;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  char *dst;
  qsizetype len;
  QByteArray *result;
  QStringView in_stack_00000328;
  char *in_stack_ffffffffffffff98;
  Initialization in_stack_ffffffffffffffac;
  qsizetype in_stack_ffffffffffffffb0;
  QByteArray *in_stack_ffffffffffffffb8;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QStringView::size(&local_18);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  QByteArray::constData((QByteArray *)0x53e81d);
  pcVar1 = convertFromUnicode(in_stack_ffffffffffffff98,in_stack_00000328);
  pcVar2 = QByteArray::constData((QByteArray *)0x53e859);
  QByteArray::truncate(in_RDI,pcVar1 + -(long)pcVar2,__length);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QByteArray QUtf8::convertFromUnicode(QStringView in)
{
    qsizetype len = in.size();

    // create a QByteArray with the worst case scenario size
    QByteArray result(len * 3, Qt::Uninitialized);
    char *dst = const_cast<char *>(result.constData());
    dst = convertFromUnicode(dst, in);
    result.truncate(dst - result.constData());
    return result;
}